

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O3

int __thiscall
helics::BrokerBase::parseArgs
          (BrokerBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ParseOutput PVar1;
  shared_ptr<helics::helicsCLI11App> sVar2;
  shared_ptr<helics::helicsCLI11App> sApp;
  shared_ptr<helics::helicsCLI11App> app;
  App_p local_40;
  element_type *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  undefined1 local_20 [16];
  
  sVar2 = generateBaseCLI((BrokerBase *)local_20);
  (*this->_vptr_BrokerBase[8])
            (&local_30,this,
             sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  local_40.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_30;
  local_40.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_28;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_28->_M_use_count = local_28->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_28->_M_use_count = local_28->_M_use_count + 1;
    }
  }
  CLI::App::add_subcommand((App *)local_20._0_8_,&local_40);
  if (local_40.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  PVar1 = helicsCLI11App::
          helics_parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((helicsCLI11App *)local_20._0_8_,args);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20._8_8_);
  }
  return PVar1;
}

Assistant:

int BrokerBase::parseArgs(std::vector<std::string> args)
{
    auto app = generateBaseCLI();
    auto sApp = generateCLI();
    app->add_subcommand(sApp);
    auto res = app->helics_parse(std::move(args));
    return static_cast<int>(res);
}